

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

void __thiscall
QHttpHeaders::setDateTimeValue(QHttpHeaders *this,QAnyStringView name,QDateTime *dateTime)

{
  QAnyStringView newValue;
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QDateTime::isValid();
  if (cVar1 == '\0') {
    local_50.d._0_4_ = 2;
    local_50.size._4_4_ = 0;
    local_50.d._4_4_ = 0;
    local_50.ptr._0_4_ = 0;
    local_50._12_8_ = 0;
    local_38 = "default";
    QMessageLogger::warning
              ((char *)&local_50,"QHttpHeaders::setDateTimeValue: invalid QDateTime value received")
    ;
  }
  else {
    QNetworkHeadersPrivate::toHttpDate((QByteArray *)&local_50,dateTime);
    newValue._4_8_ = local_50._12_8_;
    newValue.field_0._0_4_ = local_50.ptr._0_4_;
    newValue.m_size._4_4_ = local_50.size._4_4_;
    replaceOrAppend(this,name,newValue);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpHeaders::setDateTimeValue(QAnyStringView name, const QDateTime &dateTime)
{
    if (!dateTime.isValid()) {
        qWarning("QHttpHeaders::setDateTimeValue: invalid QDateTime value received");
        return;
    }
    replaceOrAppend(name, QNetworkHeadersPrivate::toHttpDate(dateTime));
}